

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

void __thiscall OPL_DOSBOXdump::WriteReg(OPL_DOSBOXdump *this,int reg,int v)

{
  uint uVar1;
  byte local_1c [4];
  int local_18;
  BYTE cmd [3];
  BYTE chipnum;
  int v_local;
  int reg_local;
  OPL_DOSBOXdump *this_local;
  
  local_18 = v;
  _cmd = reg;
  if ((this->super_OPLDump).File != (FILE *)0x0) {
    local_1c[3] = (byte)((uint)reg >> 8);
    if (local_1c[3] != (this->super_OPLDump).CurChip) {
      (this->super_OPLDump).CurChip = local_1c[3];
      fputc(local_1c[3] + 2,(FILE *)(this->super_OPLDump).File);
    }
    uVar1 = _cmd & 0xff;
    local_1c[0] = 4;
    local_1c[1] = (byte)_cmd;
    local_1c[2] = (byte)local_18;
    _cmd = uVar1;
    fwrite(local_1c + (int)(uint)(4 < uVar1),1,(long)(int)(3 - (uint)(4 < uVar1)),
           (FILE *)(this->super_OPLDump).File);
    return;
  }
  __assert_fail("File != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/oplsynth/music_opldumper_mididevice.cpp"
                ,0xd6,"virtual void OPL_DOSBOXdump::WriteReg(int, int)");
}

Assistant:

virtual void WriteReg(int reg, int v)
	{
		assert(File != NULL);
		BYTE chipnum = reg >> 8;
		if (chipnum != CurChip)
		{
			CurChip = chipnum;
			fputc(chipnum + 2, File);
		}
		reg &= 255;
		BYTE cmd[3] = { 4, BYTE(reg), BYTE(v) };
		fwrite (cmd + (reg > 4), 1, 3 - (reg > 4), File);
	}